

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
MinVR::VRDataIndex::
getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,VRDataIndex *this,string *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defaultVal,string *nameSpace,bool inherit)

{
  pointer pcVar1;
  iterator iVar2;
  long *plVar3;
  string local_50;
  
  pcVar1 = (nameSpace->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + nameSpace->_M_string_length);
  iVar2 = _getEntry(this,key,&local_50,inherit);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar2._M_node == &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,defaultVal);
  }
  else {
    plVar3 = (long *)(**(code **)(**(long **)(iVar2._M_node + 2) + 0x18))();
    (**(code **)(*plVar3 + 0x78))(__return_storage_ptr__,plVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

T getValueWithDefault(const std::string &key,
                        const T &defaultVal,
                        const std::string nameSpace = "",
                        const bool inherit = true) const {
    VRDataMap::iterator p =
      const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit);

    if (p == _theIndex.end()) {
      return defaultVal;
    } else {
      return p->second->getValue();
    }
  }